

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O2

unique_ptr<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>_> __thiscall
TasGrid::GridReaderVersion5<TasGrid::GridSequence>::read<TasGrid::IO::mode_binary_type>
          (GridReaderVersion5<TasGrid::GridSequence> *this,AccelerationContext *acc,istream *is)

{
  bool bVar1;
  int iVar2;
  TypeOneDRule TVar3;
  GridSequence *this_00;
  int in_R8D;
  MultiIndexSet local_40;
  AccelerationContext *local_18;
  
  local_18 = acc;
  Utils::make_unique<TasGrid::GridSequence,TasGrid::AccelerationContext_const*&>
            ((Utils *)this,&local_18);
  iVar2 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  *(int *)(*(long *)this + 0x10) = iVar2;
  iVar2 = IO::readNumber<TasGrid::IO::mode_binary_type,int>(is);
  *(int *)(*(long *)this + 0x14) = iVar2;
  TVar3 = IO::readRule<TasGrid::IO::mode_binary_type>(is);
  *(TypeOneDRule *)(*(long *)this + 0x90) = TVar3;
  bVar1 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_40,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x18),&local_40);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_40.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar1 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar1) {
    MultiIndexSet::MultiIndexSet<TasGrid::IO::mode_binary_type>(&local_40,is);
    MultiIndexSet::operator=((MultiIndexSet *)(*(long *)this + 0x40),&local_40);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&local_40.indexes.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar1 = IO::readFlag<TasGrid::IO::mode_binary_type>(is);
  if (bVar1) {
    IO::readData2D<TasGrid::IO::mode_binary_type,double,int,int>
              ((Data2D<double> *)&local_40,(IO *)is,
               (istream *)(ulong)*(uint *)(*(long *)this + 0x14),*(int *)(*(long *)this + 0x20),
               in_R8D);
    Data2D<double>::operator=((Data2D<double> *)(*(long *)this + 0x98),(Data2D<double> *)&local_40);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_40.indexes);
  }
  this_00 = *(GridSequence **)this;
  if (0 < (this_00->super_BaseCanonicalGrid).num_outputs) {
    StorageSet::StorageSet<TasGrid::IO::mode_binary_type>((StorageSet *)&local_40,is);
    StorageSet::operator=((StorageSet *)(*(long *)this + 0x68),(StorageSet *)&local_40);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_40.indexes);
    this_00 = *(GridSequence **)this;
  }
  GridSequence::prepareSequence(this_00,0);
  return (__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
          )(__uniq_ptr_data<TasGrid::GridSequence,_std::default_delete<TasGrid::GridSequence>,_true,_true>
            )this;
}

Assistant:

static std::unique_ptr<GridSequence> read(AccelerationContext const *acc, std::istream &is){
        std::unique_ptr<GridSequence> grid = Utils::make_unique<GridSequence>(acc);

        grid->num_dimensions = IO::readNumber<iomode, int>(is);
        grid->num_outputs = IO::readNumber<iomode, int>(is);
        grid->rule = IO::readRule<iomode>(is);

        if (IO::readFlag<iomode>(is)) grid->points = MultiIndexSet(is, iomode());
        if (IO::readFlag<iomode>(is)) grid->needed = MultiIndexSet(is, iomode());

        if (IO::readFlag<iomode>(is))
            grid->surpluses = IO::readData2D<iomode, double>(is, grid->num_outputs, grid->points.getNumIndexes());

        if (grid->num_outputs > 0) grid->values = StorageSet(is, iomode());

        grid->prepareSequence(0);

        return grid;
    }